

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O3

int FmsMeshValidate(FmsMesh mesh)

{
  FmsInt *pFVar1;
  char **ppcVar2;
  FmsComponent *ppFVar3;
  FmsComponent pFVar4;
  _FmsPart_private *p_Var5;
  FmsDomain pFVar6;
  char *__s1;
  int iVar7;
  ulong uVar8;
  FmsInt FVar9;
  FmsInt FVar10;
  FmsInt FVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  FmsInt FVar15;
  bool bVar16;
  
  if (mesh == (FmsMesh)0x0) {
    iVar12 = 1;
  }
  else {
    pFVar1 = mesh->domain_offsets;
    iVar12 = 2;
    if (*pFVar1 == 0) {
      FVar11 = mesh->num_domain_names;
      iVar12 = 3;
      if ((pFVar1[FVar11] == mesh->num_domains) &&
         (iVar12 = 4, mesh->partition_id < mesh->num_partitions)) {
        if (FVar11 != 0) {
          FVar10 = 0;
          uVar8 = 0;
          do {
            uVar13 = pFVar1[FVar10 + 1];
            if (uVar8 < uVar13) {
              uVar14 = uVar8;
              do {
                if (mesh->domains[uVar14]->name != mesh->domain_names[FVar10]) {
                  return 5;
                }
                if (uVar14 != mesh->domains[uVar14]->id + uVar8) {
                  return 6;
                }
                uVar14 = uVar14 + 1;
              } while (uVar13 != uVar14);
            }
            FVar10 = FVar10 + 1;
            uVar8 = uVar13;
          } while (FVar10 != FVar11);
        }
        uVar8 = mesh->num_comps;
        if (uVar8 != 0) {
          ppcVar2 = mesh->domain_names;
          ppFVar3 = mesh->comps;
          bVar16 = true;
          uVar13 = 0;
          iVar12 = 9;
          do {
            pFVar4 = ppFVar3[uVar13];
            if (pFVar4->id != uVar13) {
              return 7;
            }
            if (pFVar4->dim == 0x7f) {
              return 8;
            }
            FVar10 = pFVar4->num_parts;
            if (FVar10 != 0) {
              if (FVar11 == 0) goto LAB_00105245;
              p_Var5 = pFVar4->parts;
              FVar9 = 0;
              do {
                pFVar6 = p_Var5[FVar9].domain;
                __s1 = pFVar6->name;
                FVar15 = 0;
                while (iVar7 = strcmp(__s1,ppcVar2[FVar15]), iVar7 != 0) {
                  FVar15 = FVar15 + 1;
                  if (FVar11 == FVar15) goto LAB_00105245;
                }
                if (pFVar1[FVar15 + 1] - pFVar1[FVar15] <= pFVar6->id) {
                  iVar12 = 10;
                  goto LAB_00105245;
                }
                if (mesh->domains[pFVar1[FVar15] + pFVar6->id] != pFVar6) {
                  iVar12 = 0xb;
                  goto LAB_00105245;
                }
                FVar9 = FVar9 + 1;
              } while (FVar9 != FVar10);
            }
            uVar13 = uVar13 + 1;
            bVar16 = uVar13 < uVar8;
          } while (uVar13 != uVar8);
          iVar12 = 9;
LAB_00105245:
          if (bVar16) {
            return iVar12;
          }
        }
        if (mesh->num_tags == 0) {
          iVar12 = 0;
        }
        else {
          FVar11 = 0;
          iVar12 = 0;
          do {
            pFVar4 = mesh->tags[FVar11]->comp;
            uVar13 = pFVar4->id;
            if (uVar8 <= uVar13) {
              return 0xc;
            }
            if (mesh->comps[uVar13] != pFVar4) {
              return 0xd;
            }
            FVar11 = FVar11 + 1;
          } while (mesh->num_tags != FVar11);
        }
      }
    }
  }
  return iVar12;
}

Assistant:

int FmsMeshValidate(FmsMesh mesh) {
  if (!mesh) { E_RETURN(1); }
  // Perform some validation
  if (mesh->domain_offsets[0] != 0) { E_RETURN(2); }
  if (mesh->domain_offsets[mesh->num_domain_names] != mesh->num_domains) {
    E_RETURN(3);
  }
  if (mesh->partition_id >= mesh->num_partitions) { E_RETURN(4); }
  // Check domains for consistency
  for (FmsInt name_id = 0; name_id < mesh->num_domain_names; name_id++) {
    const FmsInt name_start = mesh->domain_offsets[name_id];
    const FmsInt name_end = mesh->domain_offsets[name_id+1];
    for (FmsInt domain_id = name_start; domain_id < name_end; domain_id++) {
      FmsDomain domain = mesh->domains[domain_id];
      if (domain->name != mesh->domain_names[name_id]) { E_RETURN(5); }
      if (name_start + domain->id != domain_id) { E_RETURN(6); }
      // TODO: Check that all side ids are in the expected ranges
    }
  }
  // Check that all components use domains from the same mesh
  char **domain_names = mesh->domain_names;
  for (FmsInt comp_id = 0; comp_id < mesh->num_comps; comp_id++) {
    FmsComponent comp = mesh->comps[comp_id];
    if (comp->id != comp_id) { E_RETURN(7); }
    if (comp->dim == FMS_INVALID_DIM) { E_RETURN(8); }
    for (FmsInt part_id = 0; part_id < comp->num_parts; part_id++) {
      FmsDomain domain = comp->parts[part_id].domain;
      FmsInt domain_name_id = 0;
      for ( ; 1; domain_name_id++) {
        if (domain_name_id == mesh->num_domain_names) { E_RETURN(9); }
        if (strcmp(domain->name, domain_names[domain_name_id]) == 0) { break; }
      }
      FmsInt b_offset = mesh->domain_offsets[domain_name_id];
      FmsInt num_domains = mesh->domain_offsets[domain_name_id+1] - b_offset;
      if (domain->id >= num_domains) { E_RETURN(10); }
      if (mesh->domains[b_offset + domain->id] != domain) { E_RETURN(11); }
    }
  }
  // Check that all tags use components from the same mesh
  for (FmsInt tag_id = 0; tag_id < mesh->num_tags; tag_id++) {
    FmsTag tag = mesh->tags[tag_id];
    FmsInt comp_id = tag->comp->id;
    if (comp_id >= mesh->num_comps) { E_RETURN(12); }
    if (mesh->comps[comp_id] != tag->comp) { E_RETURN(13); }
  }
  return 0;
}